

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

char * readLine(redisReader *r,int *_len)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  char *s;
  
  sVar1 = r->pos;
  s = r->buf + sVar1;
  pcVar3 = seekNewline(s,r->len - sVar1);
  if (pcVar3 == (char *)0x0) {
    s = (char *)0x0;
  }
  else {
    iVar2 = (int)pcVar3 - (int)s;
    r->pos = (long)(iVar2 + 2) + sVar1;
    if (_len != (int *)0x0) {
      *_len = iVar2;
    }
  }
  return s;
}

Assistant:

static char *readLine(redisReader *r, int *_len) {
    char *p, *s;
    int len;

    p = r->buf+r->pos;
    s = seekNewline(p,(r->len-r->pos));
    if (s != NULL) {
        len = s-(r->buf+r->pos);
        r->pos += len+2; /* skip \r\n */
        if (_len) *_len = len;
        return p;
    }
    return NULL;
}